

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtoa.c
# Opt level: O3

double sb_stdnan(int sign)

{
  return *(double *)(&DAT_00111540 + (ulong)(sign == 0) * 8);
}

Assistant:

double
sb_stdnan(int sign)
{
    U rv;
    word0(&rv) = NAN_WORD0;
    word1(&rv) = NAN_WORD1;
    if (sign)
        word0(&rv) |= Sign_bit;
    return dval(&rv);
}